

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::Selectable(char *label,bool selected,ImGuiSelectableFlags flags,ImVec2 *size_arg)

{
  ImGuiItemStatusFlags *pIVar1;
  ImGuiNavLayer nav_layer;
  ImGuiWindow *this;
  ImVec2 p_min;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImU32 fill_col;
  byte bVar4;
  byte bVar5;
  undefined7 in_register_00000031;
  int idx;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  bool hovered;
  bool held;
  ImGuiID local_b4;
  uint local_b0;
  float local_ac;
  ImRect local_a8;
  ImVec2 local_98;
  ImGuiID local_8c;
  undefined1 local_88 [16];
  ImVec2 local_70;
  ImVec2 local_68;
  ImVec2 local_50;
  ImVec2 label_size;
  ImRect local_40;
  
  pIVar2 = GImGui;
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if (this->SkipItems != false) {
    return false;
  }
  local_b0 = (uint)CONCAT71(in_register_00000031,selected);
  local_b4 = ImGuiWindow::GetID(this,label,(char *)0x0);
  local_68 = CalcTextSize(label,(char *)0x0,true,-1.0);
  fVar9 = (*size_arg).x;
  fVar10 = (*size_arg).y;
  uVar7 = -(uint)(fVar9 != 0.0);
  uVar8 = -(uint)(fVar10 != 0.0);
  local_98.x = (float)(~uVar7 & (uint)local_68.x | (uint)fVar9 & uVar7);
  local_98.y = (float)(~uVar8 & (uint)local_68.y | (uint)fVar10 & uVar8);
  local_ac = (this->DC).CursorPos.x;
  local_88 = ZEXT416((uint)((this->DC).CursorPos.y + (this->DC).CurrLineTextBaseOffset));
  label_size = local_68;
  ItemSize(&local_98,0.0);
  local_a8.Min.x = local_ac;
  if ((flags & 2U) != 0) {
    local_a8.Min.x = (this->ParentWorkRect).Min.x;
  }
  if ((((uint)flags >> 0x18 & 1) != 0) || ((size_arg->x == 0.0 && (!NAN(size_arg->x))))) {
    fVar9 = (&(this->WorkRect).Max)[flags & 2].x - local_a8.Min.x;
    uVar7 = -(uint)(fVar9 <= local_68.x);
    local_98.x = (float)(uVar7 & (uint)local_68.x | ~uVar7 & (uint)fVar9);
  }
  local_70.x = local_ac;
  local_70.y = (float)local_88._0_4_;
  local_50.x = local_98.x + local_a8.Min.x;
  local_50.y = local_98.y + (float)local_88._0_4_;
  local_a8.Min.y = (float)local_88._0_4_;
  local_a8.Max = local_50;
  if (((uint)flags >> 0x1b & 1) == 0) {
    fVar9 = 0.0;
    if ((flags & 2U) == 0) {
      fVar9 = (pIVar2->Style).ItemSpacing.x;
    }
    fVar10 = (pIVar2->Style).ItemSpacing.y;
    fVar11 = (float)(int)(fVar10 * 0.5);
    local_a8.Min.x = local_a8.Min.x - (float)(int)(fVar9 * 0.5);
    local_a8.Min.y = (float)local_88._0_4_ - fVar11;
    local_a8.Max.y = local_50.y + (fVar10 - fVar11);
    local_a8.Max.x = local_50.x + (fVar9 - (float)(int)(fVar9 * 0.5));
  }
  local_88._0_4_ = (this->ClipRect).Min.x;
  local_ac = (this->ClipRect).Max.x;
  if ((flags & 2U) != 0) {
    fVar9 = (this->ParentWorkRect).Max.x;
    (this->ClipRect).Min.x = (this->ParentWorkRect).Min.x;
    (this->ClipRect).Max.x = fVar9;
  }
  bVar3 = ItemAdd(&local_a8,local_b4,(ImRect *)0x0,(flags & 8U) >> 1);
  if ((flags & 2U) != 0) {
    (this->ClipRect).Min.x = (float)local_88._0_4_;
    (this->ClipRect).Max.x = local_ac;
  }
  if (!bVar3) {
    return false;
  }
  bVar4 = (byte)((pIVar2->CurrentItemFlags & 4U) >> 2) | (flags & 8U) == 0;
  local_ac = (float)(uint)bVar4;
  if (bVar4 == 0) {
    BeginDisabled(true);
  }
  if ((flags & 2U) != 0) {
    if ((this->DC).CurrentColumns == (ImGuiOldColumns *)0x0) {
      if (pIVar2->CurrentTable != (ImGuiTable *)0x0) {
        TablePushBackgroundChannel();
      }
    }
    else {
      PushColumnsBackground();
    }
  }
  local_88._0_8_ = label;
  uVar8 = (uint)flags >> 0x10 & 0x80;
  uVar7 = uVar8 + 0x120;
  if ((flags & 4U) == 0) {
    uVar7 = uVar8;
  }
  bVar3 = ButtonBehavior(&local_a8,local_b4,&hovered,&held,
                         (flags & 0x10U) << 8 |
                         uVar7 + ((uint)flags >> 0x12 & 0x10 | (uint)flags >> 3 & 0x20000));
  uVar7 = local_b0;
  if ((((uint)flags >> 0x15 & 1) != 0) && (pIVar2->NavJustMovedToId != 0)) {
    bVar6 = pIVar2->NavJustMovedToId == local_b4 &&
            pIVar2->NavJustMovedToFocusScopeId == (this->DC).NavFocusScopeIdCurrent;
    bVar3 = bVar3 || bVar6;
    uVar7 = (uint)(byte)(bVar6 | (byte)local_b0);
  }
  bVar4 = (byte)uVar7;
  bVar6 = true;
  if ((bVar3 != false) || ((bVar6 = false, ((uint)flags >> 0x1a & 1) != 0 && (hovered != false)))) {
    if ((pIVar2->NavDisableMouseHover == false) &&
       ((pIVar2->NavWindow == this &&
        (nav_layer = pIVar2->NavLayer, nav_layer == (this->DC).NavLayerCurrent)))) {
      local_8c = (this->DC).NavFocusScopeIdCurrent;
      local_68.x._0_1_ = bVar4;
      local_40 = WindowRectAbsToRel(this,&local_a8);
      SetNavID(local_b4,nav_layer,local_8c,&local_40);
      pIVar2->NavDisableHighlight = true;
      bVar4 = local_68.x._0_1_;
    }
    if (bVar6 == false) {
      bVar6 = false;
    }
    else {
      MarkItemEdited(local_b4);
      bVar6 = true;
    }
  }
  bVar5 = (byte)local_b0;
  if ((flags & 0x10U) != 0) {
    SetItemAllowOverlap();
    bVar5 = (byte)local_b0;
  }
  if (bVar4 != bVar5) {
    pIVar1 = &(pIVar2->LastItemData).StatusFlags;
    *(byte *)pIVar1 = (byte)*pIVar1 | 8;
  }
  if (((uint)flags >> 0x19 & 1) == 0 || held != true) {
    if (((bVar4 | hovered) & 1) == 0) goto LAB_0014f37a;
    idx = 0x18;
    if ((hovered & 1U) != 0) {
      idx = held + 0x19;
    }
  }
  else {
    hovered = true;
    idx = held + 0x19;
  }
  fill_col = GetColorU32(idx,1.0);
  p_min.y = local_a8.Min.y;
  p_min.x = local_a8.Min.x;
  RenderFrame(p_min,local_a8.Max,fill_col,false,0.0);
LAB_0014f37a:
  RenderNavHighlight(&local_a8,local_b4,10);
  if ((flags & 2U) != 0) {
    if ((this->DC).CurrentColumns == (ImGuiOldColumns *)0x0) {
      if (pIVar2->CurrentTable != (ImGuiTable *)0x0) {
        TablePopBackgroundChannel();
      }
    }
    else {
      PopColumnsBackground();
    }
  }
  RenderTextClipped(&local_70,&local_50,(char *)local_88._0_8_,(char *)0x0,&label_size,
                    &(pIVar2->Style).SelectableTextAlign,&local_a8);
  if ((((bVar6 != false) && ((flags & 1U) == 0)) && ((this->Flags & 0x4000000U) != 0)) &&
     (((pIVar2->LastItemData).InFlags & 0x20) == 0)) {
    CloseCurrentPopup();
  }
  if (local_ac._0_1_ == '\0') {
    EndDisabled();
    return bVar6;
  }
  return bVar6;
}

Assistant:

bool ImGui::DragFloatRange2(const char* label, float* v_current_min, float* v_current_max, float v_speed, float v_min, float v_max, const char* format, const char* format_max, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2, CalcItemWidth());

    float min_min = (v_min >= v_max) ? -FLT_MAX : v_min;
    float min_max = (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max);
    ImGuiSliderFlags min_flags = flags | ((min_min == min_max) ? ImGuiSliderFlags_ReadOnly : 0);
    bool value_changed = DragScalar("##min", ImGuiDataType_Float, v_current_min, v_speed, &min_min, &min_max, format, min_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    float max_min = (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min);
    float max_max = (v_min >= v_max) ? FLT_MAX : v_max;
    ImGuiSliderFlags max_flags = flags | ((max_min == max_max) ? ImGuiSliderFlags_ReadOnly : 0);
    value_changed |= DragScalar("##max", ImGuiDataType_Float, v_current_max, v_speed, &max_min, &max_max, format_max ? format_max : format, max_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();

    return value_changed;
}